

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::ResetFence(VulkanLogicalDevice *this,VkFence fence)

{
  VkResult VVar1;
  string msg;
  string local_38;
  VkFence local_18;
  
  local_18 = fence;
  VVar1 = (*vkResetFences)(this->m_VkDevice,1,&local_18);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[23]>(&local_38,(char (*) [23])"vkResetFences() failed");
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"ResetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x28a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::ResetFence(VkFence fence) const
{
    VkResult err = vkResetFences(m_VkDevice, 1, &fence);
    DEV_CHECK_ERR(err == VK_SUCCESS, "vkResetFences() failed");
    return err;
}